

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr
xmlSchemaAddType(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,
                xmlChar *name,xmlChar *nsName,xmlNodePtr node,int topLevel)

{
  int iVar1;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlSchemaParserCtxtPtr local_48;
  xmlSchemaTypePtr ret;
  xmlNodePtr node_local;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaTypeType type_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_48 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0xe0);
    if (local_48 == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(local_48,0,0xe0);
      local_48->type = type;
      local_48->error = (xmlSchemaValidityErrorFunc)name;
      local_48->redefined = (xmlSchemaBucketPtr_conflict)nsName;
      *(xmlNodePtr *)&local_48->counter = node;
      if (topLevel == 0) {
        if ((local_48 != (xmlSchemaParserCtxtPtr)0x0) &&
           (iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,local_48), iVar1 < 0)
           ) {
          xmlSchemaPErrMemory(ctxt);
          (*xmlFree)(local_48);
          local_48 = (xmlSchemaParserCtxtPtr)0x0;
        }
      }
      else {
        if (ctxt->isRedefine != 0) {
          pxVar2 = xmlSchemaAddRedef(ctxt,ctxt->redefined,local_48,name,nsName);
          ctxt->redef = pxVar2;
          if (ctxt->redef == (xmlSchemaRedefPtr_conflict)0x0) {
            (*xmlFree)(local_48);
            return (xmlSchemaTypePtr)0x0;
          }
          ctxt->redefCounter = 0;
        }
        if ((local_48 != (xmlSchemaParserCtxtPtr)0x0) &&
           (iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,local_48), iVar1 < 0)
           ) {
          xmlSchemaPErrMemory(ctxt);
          (*xmlFree)(local_48);
          local_48 = (xmlSchemaParserCtxtPtr)0x0;
        }
      }
      if ((local_48 != (xmlSchemaParserCtxtPtr)0x0) &&
         (iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,local_48), iVar1 < 0)) {
        xmlSchemaPErrMemory(ctxt);
      }
      ctxt_local = local_48;
    }
  }
  return (xmlSchemaTypePtr)ctxt_local;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaAddType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
		 xmlSchemaTypeType type,
                 const xmlChar * name, const xmlChar * nsName,
		 xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->type = type;
    ret->name = name;
    ret->targetNamespace = nsName;
    ret->node = node;
    if (topLevel) {
	if (ctxt->isRedefine) {
	    ctxt->redef = xmlSchemaAddRedef(ctxt, ctxt->redefined,
		ret, name, nsName);
	    if (ctxt->redef == NULL) {
		xmlFree(ret);
		return(NULL);
	    }
	    ctxt->redefCounter = 0;
	}
	WXS_ADD_GLOBAL(ctxt, ret);
    } else
	WXS_ADD_LOCAL(ctxt, ret);
    WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}